

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_stitch(jit_State *J,BCIns *pc)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  BCReg BVar4;
  int *piVar5;
  ulong uVar6;
  long in_RSI;
  long in_RDI;
  BCIns *oldpc;
  void *cf;
  lua_State *L;
  int olderr;
  BCIns *in_stack_ffffffffffffffb8;
  jit_State *J_00;
  
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  lVar3 = *(long *)(in_RDI + 0x68);
  uVar6 = *(ulong *)(lVar3 + 0x30) & 0xfffffffffffffffc;
  uVar2 = *(undefined4 *)(uVar6 + 0x1c);
  *(int *)(uVar6 + 0x1c) = (int)in_RSI;
  J_00 = *(jit_State **)(lVar3 + 0x10);
  BVar4 = cur_topslot((GCproto *)
                      ((ulong)*(uint *)((ulong)*(uint *)(*(long *)(lVar3 + 0x10) + -8) + 0x10) -
                      0x40),(BCIns *)(in_RSI + 4),*(uint32_t *)(uVar6 + 4));
  *(GCRef **)(lVar3 + 0x18) = &(J_00->cur).nextgc + (ulong)BVar4 * 2;
  lj_trace_stitch(J_00,in_stack_ffffffffffffffb8);
  *(undefined4 *)(uVar6 + 0x1c) = uVar2;
  piVar5 = __errno_location();
  *piVar5 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_stitch(jit_State *J, const BCIns *pc)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  setcframe_pc(cf, pc);
  /* Before dispatch, have to bias PC by 1. */
  L->top = L->base + cur_topslot(curr_proto(L), pc+1, cframe_multres_n(cf));
  lj_trace_stitch(J, pc-1);  /* Point to the CALL instruction. */
  setcframe_pc(cf, oldpc);
  ERRNO_RESTORE
}